

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterLoadRowid(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  Fts5Data *pFVar2;
  i64 iVar3;
  
  pFVar2 = pIter->pLeaf;
  iVar3 = pIter->iLeafOffset;
  do {
    if (iVar3 < pFVar2->szLeaf) {
      bVar1 = sqlite3Fts5GetVarint(pFVar2->p + iVar3,(u64 *)&pIter->iRowid);
      pIter->iLeafOffset = (ulong)bVar1 + iVar3;
      return;
    }
    fts5SegIterNextPage(p,pIter);
    pFVar2 = pIter->pLeaf;
    iVar3 = 4;
  } while (pFVar2 != (Fts5Data *)0x0);
  if (p->rc == 0) {
    p->rc = 0x10b;
  }
  return;
}

Assistant:

static void fts5SegIterLoadRowid(Fts5Index *p, Fts5SegIter *pIter){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  i64 iOff = pIter->iLeafOffset;

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( pIter->pLeaf==0 ){
      if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
      return;
    }
    iOff = 4;
    a = pIter->pLeaf->p;
  }
  iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&pIter->iRowid);
  pIter->iLeafOffset = iOff;
}